

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

StatusOr<int>
google::protobuf::json_internal::Proto3Type::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  Status *x;
  Enum **ppEVar2;
  Enum *this;
  RepeatedPtrField<google::protobuf::EnumValue> *this_00;
  string *psVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  byte in_R8B;
  undefined1 auVar5 [16];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  StatusOr<int> SVar6;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292> local_110;
  string local_100;
  undefined1 local_e0 [16];
  Status local_d0;
  int32_t local_c4;
  Field local_c0;
  size_t local_b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b0;
  int32_t local_9c;
  Field local_98;
  size_t local_90;
  undefined1 local_88 [16];
  reference local_78;
  EnumValue *ev;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::EnumValue> *__range3;
  Status local_48;
  Status _status;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  bool case_insensitive_local;
  Field f_local;
  string_view name_local;
  
  name_local._M_len = CONCAT71(in_register_00000009,case_insensitive);
  f_local = (Field)name._M_str;
  name_local._M_str = (char *)f;
  ResolverPool::Field::EnumType((Field *)&_status);
  x = absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*>::
      status((StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)&_status);
  absl::lts_20240722::Status::Status(&local_48,x);
  bVar1 = absl::lts_20240722::Status::ok(&local_48);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20240722::StatusOr<int>::StatusOr<const_absl::lts_20240722::Status,_0>
              ((StatusOr<int> *)f,&local_48);
  }
  absl::lts_20240722::Status::~Status(&local_48);
  if (!bVar1) {
    ppEVar2 = absl::lts_20240722::
              StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*>::operator*
                        ((StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)
                         &_status);
    this = ResolverPool::Enum::proto(*ppEVar2);
    this_00 = Enum::enumvalue(this);
    __end3 = RepeatedPtrField<google::protobuf::EnumValue>::begin(this_00);
    ev = (EnumValue *)RepeatedPtrField<google::protobuf::EnumValue>::end(this_00);
    while( true ) {
      bVar1 = internal::operator!=(&__end3,(iterator *)&ev);
      if (!bVar1) break;
      local_78 = internal::RepeatedPtrIterator<const_google::protobuf::EnumValue>::operator*
                           (&__end3);
      if ((in_R8B & 1) == 0) {
        psVar3 = EnumValue::name_abi_cxx11_(local_78);
        __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
        local_c0 = f_local;
        local_b8 = name_local._M_len;
        __y._M_str = (char *)name_local._M_len;
        __y._M_len = (size_t)f_local;
        local_b0 = __x;
        bVar1 = std::operator==(__x,__y);
        if (bVar1) {
          local_c4 = EnumValue::number(local_78);
          absl::lts_20240722::StatusOr<int>::StatusOr<int,_0>((StatusOr<int> *)f,&local_c4);
          goto LAB_004d15f3;
        }
      }
      else {
        psVar3 = EnumValue::name_abi_cxx11_(local_78);
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
        local_98 = f_local;
        local_90 = name_local._M_len;
        local_88 = auVar5;
        uVar4 = absl::lts_20240722::EqualsIgnoreCase
                          (auVar5._0_8_,auVar5._8_8_,f_local,name_local._M_len);
        if ((uVar4 & 1) != 0) {
          local_9c = EnumValue::number(local_78);
          absl::lts_20240722::StatusOr<int>::StatusOr<int,_0>((StatusOr<int> *)f,&local_9c);
          goto LAB_004d15f3;
        }
      }
      internal::RepeatedPtrIterator<const_google::protobuf::EnumValue>::operator++(&__end3);
    }
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292>::FormatSpecTemplate
              (&local_110,"unknown enum value: \'%s\'");
    absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
              (&local_100,&local_110,(basic_string_view<char,_std::char_traits<char>_> *)&f_local);
    local_e0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_100);
    absl::lts_20240722::InvalidArgumentError(&local_d0,local_e0._0_8_,local_e0._8_8_);
    absl::lts_20240722::StatusOr<int>::StatusOr<absl::lts_20240722::Status,_0>
              ((StatusOr<int> *)f,&local_d0);
    absl::lts_20240722::Status::~Status(&local_d0);
    std::__cxx11::string::~string((string *)&local_100);
  }
LAB_004d15f3:
  absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*>::
  ~StatusOr((StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)&_status);
  SVar6.super_StatusOrData<int>._8_8_ = extraout_RDX;
  SVar6.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar6.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (case_insensitive) {
        // Two ifs to avoid doing operator== twice if the names are not equal.
        if (absl::EqualsIgnoreCase(ev.name(), name)) {
          return ev.number();
        }
      } else if (ev.name() == name) {
        return ev.number();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }